

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_state_helo_resp(connectdata *conn,int smtpcode,smtpstate instate)

{
  SessionHandle *data;
  CURLcode result;
  smtpstate instate_local;
  int smtpcode_local;
  connectdata *conn_local;
  
  data._4_4_ = CURLE_OK;
  if (smtpcode / 100 == 2) {
    state(conn,SMTP_STOP);
  }
  else {
    Curl_failf(conn->data,"Remote access denied: %d",(ulong)(uint)smtpcode);
    data._4_4_ = CURLE_REMOTE_ACCESS_DENIED;
  }
  return data._4_4_;
}

Assistant:

static CURLcode smtp_state_helo_resp(struct connectdata *conn, int smtpcode,
                                     smtpstate instate)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;

  (void)instate; /* no use for this yet */

  if(smtpcode/100 != 2) {
    failf(data, "Remote access denied: %d", smtpcode);
    result = CURLE_REMOTE_ACCESS_DENIED;
  }
  else
    /* End of connect phase */
    state(conn, SMTP_STOP);

  return result;
}